

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O0

bool google::protobuf::internal::InternalPackFromLite
               (MessageLite *message,string_view type_url_prefix,string_view type_name,
               UrlType *dst_url,ValueType *dst_value)

{
  bool bVar1;
  string_view type_url_prefix_00;
  string_view message_name;
  string local_58;
  UrlType *local_38;
  UrlType *dst_url_local;
  MessageLite *message_local;
  string_view type_name_local;
  string_view type_url_prefix_local;
  
  type_name_local._M_str = (char *)type_url_prefix._M_len;
  type_name_local._M_len = (size_t)type_name._M_str;
  message_local = (MessageLite *)type_name._M_len;
  type_url_prefix_00._M_str = (char *)dst_url;
  type_url_prefix_00._M_len = (size_t)type_url_prefix._M_str;
  message_name._M_str = type_name_local._M_str;
  message_name._M_len = type_name_local._M_len;
  local_38 = dst_url;
  dst_url_local = (UrlType *)message;
  GetTypeUrl_abi_cxx11_(&local_58,(internal *)message_local,message_name,type_url_prefix_00);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = MessageLite::SerializeToString((MessageLite *)dst_url_local,dst_value);
  return bVar1;
}

Assistant:

bool InternalPackFromLite(const MessageLite& message,
                          absl::string_view type_url_prefix,
                          absl::string_view type_name, UrlType* dst_url,
                          ValueType* dst_value) {
  *dst_url = GetTypeUrl(type_name, type_url_prefix);
  return message.SerializeToString(dst_value);
}